

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsLineItem::boundingRect(QGraphicsLineItem *this)

{
  double dVar1;
  double atop;
  double *pdVar2;
  QLineF *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  double dVar3;
  qreal by;
  qreal ty;
  qreal rx;
  qreal lx;
  QGraphicsLineItemPrivate *d;
  qreal y2;
  qreal y1;
  qreal x2;
  qreal x1;
  QPainterPath local_70 [8];
  QPointF local_68;
  qreal local_58;
  QPointF local_50;
  qreal local_40;
  QPointF local_38;
  qreal local_28;
  QPointF local_20;
  qreal local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsLineItem *)0x98a539);
  dVar3 = (double)QPen::widthF();
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    (**(code **)((long)(in_RSI->pt1).xp + 0x20))(local_70);
    QPainterPath::controlPointRect();
    QPainterPath::~QPainterPath(local_70);
  }
  else {
    local_20 = QLineF::p1(in_RSI);
    local_10 = QPointF::x(&local_20);
    local_38 = QLineF::p2(in_RSI);
    local_28 = QPointF::x(&local_38);
    local_50 = QLineF::p1(in_RSI);
    local_40 = QPointF::y(&local_50);
    local_68 = QLineF::p2(in_RSI);
    local_58 = QPointF::y(&local_68);
    pdVar2 = qMin<double>(&local_10,&local_28);
    dVar3 = *pdVar2;
    pdVar2 = qMax<double>(&local_10,&local_28);
    dVar1 = *pdVar2;
    pdVar2 = qMin<double>(&local_40,&local_58);
    atop = *pdVar2;
    pdVar2 = qMax<double>(&local_40,&local_58);
    QRectF::QRectF(in_RDI,dVar3,atop,dVar1 - dVar3,*pdVar2 - atop);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsLineItem::boundingRect() const
{
    Q_D(const QGraphicsLineItem);
    if (d->pen.widthF() == 0.0) {
        const qreal x1 = d->line.p1().x();
        const qreal x2 = d->line.p2().x();
        const qreal y1 = d->line.p1().y();
        const qreal y2 = d->line.p2().y();
        qreal lx = qMin(x1, x2);
        qreal rx = qMax(x1, x2);
        qreal ty = qMin(y1, y2);
        qreal by = qMax(y1, y2);
        return QRectF(lx, ty, rx - lx, by - ty);
    }
    return shape().controlPointRect();
}